

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarManPoIsConst0(void *pMan,Aig_Obj_t *pObj)

{
  int Id;
  word *pwVar1;
  int local_34;
  int w;
  word *pSim;
  Ssw_RarMan_t *p;
  Aig_Obj_t *pObj_local;
  void *pMan_local;
  
  Id = Aig_ObjId(pObj);
  pwVar1 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,Id);
  local_34 = 0;
  while( true ) {
    if (*(int *)(*pMan + 4) <= local_34) {
      return 1;
    }
    if (pwVar1[local_34] != 0) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int Ssw_RarManPoIsConst0( void * pMan, Aig_Obj_t * pObj )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] )
            return 0;
    return 1;
}